

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O0

err_t Stream_Printf(stream *Stream,tchar_t *Msg,...)

{
  undefined1 local_480 [8];
  textwriter_conflict p;
  va_list Arg;
  tchar_t local_428 [8];
  tchar_t s [1024];
  tchar_t *Msg_local;
  stream *Stream_local;
  
  if (Stream == (stream *)0x0) {
    Stream_local = (stream *)0xfffffffffffffffc;
  }
  else {
    local_480 = (undefined1  [8])Stream;
    if (Stream == (stream *)0x0) {
      __assert_fail("(const void*)(Stream)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x108,"err_t Stream_Printf(stream *, const tchar_t *, ...)");
    }
    p.Stream = *(stream **)(*(Stream->Base).VMT + 0xf0);
    p.InsideContent._4_4_ = 0x30;
    p.InsideContent._0_4_ = 0x10;
    vstprintf_s(local_428,0x400,Msg,(__va_list_tag *)&p.InsideContent);
    Stream_local = (stream *)TextWrite((textwriter_conflict *)local_480,local_428);
  }
  return (err_t)Stream_local;
}

Assistant:

err_t Stream_Printf(stream* Stream, const tchar_t* Msg,...)
{
    tchar_t s[MAXLINE];
    va_list Arg;
    textwriter p;
    if (!Stream)
        return ERR_INVALID_PARAM;
    p.Stream = Stream;
    p.CC = Parser_Context(Stream)->ToUTF8;
    va_start(Arg,Msg);
    vstprintf_s(s,TSIZEOF(s),Msg,Arg);
    va_end(Arg);
    return TextWrite(&p,s);
}